

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O2

void __thiscall TApp_DefaultComplex_Test::~TApp_DefaultComplex_Test(TApp_DefaultComplex_Test *this)

{
  TApp::~TApp(&this->super_TApp);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, DefaultComplex) {

    cx comp{1, 2};
    add_option(app, "-c,--complex", comp, "", true);
    args = {"-c", "4", "3"};

    std::string help = app.help();
    EXPECT_THAT(help, HasSubstr("1"));
    EXPECT_THAT(help, HasSubstr("2"));

    EXPECT_EQ(1, comp.real());
    EXPECT_EQ(2, comp.imag());

    run();

    EXPECT_EQ(4, comp.real());
    EXPECT_EQ(3, comp.imag());
}